

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_timeout.c
# Opt level: O0

void ares_timeval_diff(ares_timeval_t *tvdiff,ares_timeval_t *tvstart,ares_timeval_t *tvstop)

{
  ares_timeval_t *tvstop_local;
  ares_timeval_t *tvstart_local;
  ares_timeval_t *tvdiff_local;
  
  tvdiff->sec = tvstop->sec - tvstart->sec;
  if (tvstart->usec < tvstop->usec) {
    tvdiff->usec = tvstop->usec - tvstart->usec;
  }
  else {
    tvdiff->sec = tvdiff->sec + -1;
    tvdiff->usec = (tvstop->usec + 1000000) - tvstart->usec;
  }
  return;
}

Assistant:

void ares_timeval_diff(ares_timeval_t *tvdiff, const ares_timeval_t *tvstart,
                       const ares_timeval_t *tvstop)
{
  tvdiff->sec = tvstop->sec - tvstart->sec;
  if (tvstop->usec > tvstart->usec) {
    tvdiff->usec = tvstop->usec - tvstart->usec;
  } else {
    tvdiff->sec  -= 1;
    tvdiff->usec  = tvstop->usec + 1000000 - tvstart->usec;
  }
}